

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O0

errr next_blockheader(ang_file *f,blockheader *b)

{
  int iVar1;
  size_t len;
  uint8_t savefile_head [28];
  blockheader *b_local;
  ang_file *f_local;
  
  iVar1 = file_read(f,(char *)&len,0x1c);
  if (iVar1 == 0) {
    f_local._4_4_ = 1;
  }
  else if ((iVar1 == 0x1c) && (savefile_head[7] == '\0')) {
    my_strcpy(b->name,(char *)&len,0x10);
    b->version = savefile_head._8_4_;
    b->size = savefile_head._12_4_;
    if ((b->size & 3) != 0) {
      b->size = (4 - (b->size & 3)) + b->size;
    }
    f_local._4_4_ = 0;
  }
  else {
    f_local._4_4_ = -1;
  }
  return f_local._4_4_;
}

Assistant:

static errr next_blockheader(ang_file *f, struct blockheader *b) {
	uint8_t savefile_head[SAVEFILE_HEAD_SIZE];
	size_t len;

	len = file_read(f, (char *)savefile_head, SAVEFILE_HEAD_SIZE);
	if (len == 0) /* no more blocks */
		return 1;

	if (len != SAVEFILE_HEAD_SIZE || savefile_head[15] != 0) {
		return -1;
	}

#define RECONSTRUCT_U32B(from) \
	((uint32_t) savefile_head[from]) | \
	((uint32_t) savefile_head[from+1] << 8) | \
	((uint32_t) savefile_head[from+2] << 16) | \
	((uint32_t) savefile_head[from+3] << 24);

	my_strcpy(b->name, (char *)&savefile_head, sizeof b->name);
	b->version = RECONSTRUCT_U32B(16);
	b->size = RECONSTRUCT_U32B(20);

	/* Pad to 4 bytes */
	if (b->size % 4)
		b->size += 4 - (b->size % 4);

	return 0;
}